

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  int tok;
  char **local_38;
  
  uVar7 = (long)end - (long)ptr;
  if ((long)uVar7 < 2) {
    return -1;
  }
  bVar2 = ptr[1];
  if (bVar2 - 0xd8 < 4) {
LAB_004e894e:
    if (uVar7 < 4) {
      return -2;
    }
  }
  else {
    if (bVar2 - 0xdc < 4) goto LAB_004e8972;
    if (bVar2 == 0) {
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (cVar3 == '\x05') goto LAB_004e8972;
      if (cVar3 == '\x06') {
        if (uVar7 == 2) {
          return -2;
        }
        goto LAB_004e8972;
      }
      if (cVar3 == '\a') goto LAB_004e894e;
      if ((cVar3 == '\x16') || (cVar3 == '\x18')) goto LAB_004e8898;
      if (cVar3 != '\x1d') goto LAB_004e8972;
    }
    else if ((bVar2 == 0xff) && (0xfd < (byte)*ptr)) goto LAB_004e8972;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) != 0) {
LAB_004e8898:
      lVar5 = -2;
      lVar9 = 0;
LAB_004e88b3:
      if ((long)(lVar5 + uVar7) < 2) {
        return -1;
      }
      bVar2 = ptr[lVar9 + 3];
      if (bVar2 != 0) {
        if (bVar2 == 0xff) {
          if ((byte)ptr[lVar9 + 2] < 0xfe) goto switchD_004e893e_caseD_1d;
        }
        else {
          if (bVar2 - 0xd8 < 4) goto switchD_004e893e_caseD_7;
          if (3 < bVar2 - 0xdc) goto switchD_004e893e_caseD_1d;
        }
        goto switchD_004e893e_caseD_5;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar9 + 2])) {
      case 6:
        if (uVar7 - 4 == lVar9) {
          return -2;
        }
        break;
      case 7:
switchD_004e893e_caseD_7:
        if (lVar5 + uVar7 < 4) {
          return -2;
        }
        break;
      case 9:
      case 10:
      case 0x15:
        local_38 = nextTokPtr;
        iVar4 = little2_checkPiTarget
                          ((ENCODING *)ptr,ptr + lVar9 + 2,(char *)&tok,(int *)nextTokPtr);
        if (iVar4 == 0) {
          *local_38 = ptr + lVar9 + 2;
          return 0;
        }
        pbVar1 = (byte *)(ptr + lVar9 + 4);
        goto LAB_004e89c4;
      case 0xf:
        iVar4 = little2_checkPiTarget
                          ((ENCODING *)ptr,ptr + lVar9 + 2,(char *)&tok,(int *)nextTokPtr);
        if (iVar4 == 0) {
          *nextTokPtr = ptr + lVar9 + 2;
          return 0;
        }
        if ((long)((uVar7 - lVar9) + -4) < 2) {
          return -1;
        }
        pcVar6 = ptr + lVar9 + 4;
        if ((ptr[lVar9 + 5] == '\0') && (*pcVar6 == '>')) {
          *nextTokPtr = ptr + lVar9 + 6;
          return tok;
        }
        goto LAB_004e8967;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_004e893e_caseD_16;
      case 0x1d:
switchD_004e893e_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[lVar9 + 2] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >>
             ((byte)ptr[lVar9 + 2] & 0x1f) & 1) != 0) goto switchD_004e893e_caseD_16;
      }
switchD_004e893e_caseD_5:
      pcVar6 = ptr + lVar9 + 2;
LAB_004e8967:
      *nextTokPtr = pcVar6;
      return 0;
    }
  }
LAB_004e8972:
  *nextTokPtr = ptr;
  return 0;
switchD_004e893e_caseD_16:
  lVar9 = lVar9 + 2;
  lVar5 = lVar5 + -2;
  goto LAB_004e88b3;
LAB_004e89c4:
  pbVar8 = pbVar1;
  uVar7 = (long)end - (long)pbVar8;
  if ((long)uVar7 < 2) {
    return -1;
  }
  bVar2 = pbVar8[1];
  if (bVar2 - 0xd8 < 4) {
switchD_004e8a36_caseD_7:
    if (uVar7 < 4) {
      return -2;
    }
    pbVar1 = pbVar8 + 4;
    goto LAB_004e89c4;
  }
  if (bVar2 == 0) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar8)) {
    case 0:
    case 1:
    case 8:
      goto switchD_004e8a36_caseD_0;
    default:
      goto switchD_004e8a36_caseD_2;
    case 6:
      if (uVar7 == 2) {
        return -2;
      }
      pbVar1 = pbVar8 + 3;
      break;
    case 7:
      goto switchD_004e8a36_caseD_7;
    case 0xf:
      pbVar1 = pbVar8 + 2;
      if ((long)end - (long)pbVar1 < 2) {
        return -1;
      }
      if ((pbVar8[3] == 0) && (*pbVar1 == 0x3e)) {
        *local_38 = (char *)(pbVar8 + 4);
        return tok;
      }
    }
  }
  else {
    if (bVar2 == 0xff) {
      if (0xfd < *pbVar8) goto switchD_004e8a36_caseD_0;
    }
    else if (bVar2 - 0xdc < 4) {
switchD_004e8a36_caseD_0:
      *local_38 = (char *)pbVar8;
      return 0;
    }
switchD_004e8a36_caseD_2:
    pbVar1 = pbVar8 + 2;
  }
  goto LAB_004e89c4;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}